

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Tags::ExpandTagsArray(Tags *this)

{
  int iVar1;
  uint uVar2;
  Tag *pTVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  iVar1 = this->m_tags_size;
  uVar2 = this->m_tags_count;
  if ((int)uVar2 < iVar1) {
    return true;
  }
  iVar6 = 1;
  if (iVar1 != 0) {
    iVar6 = iVar1 * 2;
  }
  uVar7 = 0xffffffffffffffff;
  if (-1 < iVar6) {
    uVar7 = (long)iVar6 << 4 | 8;
  }
  plVar4 = (long *)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
  if (plVar4 == (long *)0x0) {
    return false;
  }
  *plVar4 = (long)iVar6;
  pTVar3 = this->m_tags;
  if ((int)uVar2 < 1) {
    if (pTVar3 == (Tag *)0x0) goto LAB_00127cd6;
  }
  else {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)plVar4 + lVar5 + 8) =
           *(undefined8 *)((long)&pTVar3->m_simple_tags + lVar5);
      *(undefined8 *)((long)plVar4 + lVar5 + 0x10) =
           *(undefined8 *)((long)&pTVar3->m_simple_tags_size + lVar5);
      lVar5 = lVar5 + 0x10;
    } while ((ulong)uVar2 << 4 != lVar5);
  }
  operator_delete__(&pTVar3[-1].m_simple_tags_size);
LAB_00127cd6:
  this->m_tags = (Tag *)(plVar4 + 1);
  this->m_tags_size = iVar6;
  return true;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (m_tags_size > m_tags_count)
    return true;  // nothing else to do

  const int size = (m_tags_size == 0) ? 1 : 2 * m_tags_size;

  Tag* const tags = new (std::nothrow) Tag[size];

  if (tags == NULL)
    return false;

  for (int idx = 0; idx < m_tags_count; ++idx) {
    m_tags[idx].ShallowCopy(tags[idx]);
  }

  delete[] m_tags;
  m_tags = tags;

  m_tags_size = size;
  return true;
}